

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_Deserialize(ktxHashList *pHead,uint kvdLen,void *pKvd)

{
  uint *key;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  char *value;
  ulong uVar5;
  ktx_error_code_e kVar6;
  uint *puVar7;
  ktx_error_code_e kVar8;
  float fVar9;
  
  kVar6 = KTX_INVALID_VALUE;
  if ((((pHead != (ktxHashList *)0x0) && (kvdLen != 0)) && (pKvd != (void *)0x0)) &&
     (kVar6 = KTX_INVALID_OPERATION, *pHead == (ktxHashList)0x0)) {
    puVar7 = (uint *)((ulong)kvdLen + (long)pKvd);
    kVar8 = KTX_SUCCESS;
    do {
      if (kVar8 != KTX_SUCCESS) {
        return kVar8;
      }
      if (puVar7 <= pKvd) {
        return KTX_SUCCESS;
      }
      kVar6 = KTX_FILE_DATA_ERROR;
      if (puVar7 < (uint *)((long)pKvd + 6U)) {
        return KTX_FILE_DATA_ERROR;
      }
      uVar1 = *pKvd;
      uVar5 = (ulong)uVar1;
      bVar2 = false;
      if (puVar7 < (uint *)((long)pKvd + uVar5 + 4)) {
        kVar8 = KTX_SUCCESS;
      }
      else {
        key = (uint *)((long)pKvd + 4);
        uVar4 = 0;
        if (uVar5 != 0) {
          uVar4 = 0;
          do {
            if (*(char *)((long)key + uVar4) == '\0') goto LAB_001d3fd7;
            uVar4 = uVar4 + 1;
          } while (uVar1 != (uint)uVar4);
          uVar4 = (ulong)uVar1;
        }
LAB_001d3fd7:
        uVar3 = (uint)uVar4;
        if (((uVar3 == uVar1) || (*(char *)((long)key + (uVar4 & 0xffffffff)) != '\0')) ||
           (((2 < uVar3 && (((char)*key == -0x11 && (*(char *)((long)pKvd + 5) == -0x45)))) &&
            (*(char *)((long)pKvd + 6U) == -0x41)))) {
          bVar2 = false;
          kVar8 = KTX_SUCCESS;
          pKvd = key;
        }
        else {
          uVar3 = uVar3 + 1;
          value = (char *)0x0;
          if (uVar1 != uVar3) {
            value = (char *)((long)key + (ulong)uVar3);
          }
          kVar8 = ktxHashList_AddKVPair(pHead,(char *)key,uVar1 - uVar3,value);
          bVar2 = true;
          pKvd = key;
          if (kVar8 == KTX_SUCCESS) {
            fVar9 = ceilf((float)uVar5 * 0.25);
            pKvd = (void *)((long)key + ((long)(fVar9 * 4.0) & 0xffffffffU));
          }
        }
      }
    } while (bVar2);
  }
  return kVar6;
}

Assistant:

KTX_error_code
ktxHashList_Deserialize(ktxHashList* pHead, unsigned int kvdLen, void* pKvd)
{
    char* src = pKvd;
    KTX_error_code result;

    if (kvdLen == 0 || pKvd == NULL || pHead == NULL)
        return KTX_INVALID_VALUE;

    if (*pHead != NULL)
        return KTX_INVALID_OPERATION;

    result = KTX_SUCCESS;
    while (result == KTX_SUCCESS && src < (char *)pKvd + kvdLen) {
        if (src + 6 > (char *)pKvd + kvdLen) {
            // Not enough space for another entry
            return KTX_FILE_DATA_ERROR;
        }

        char* key;
        unsigned int keyLen, valueLen;
        void* value;
        ktx_uint32_t keyAndValueByteSize = *((ktx_uint32_t*)src);

        if (src + 4 + keyAndValueByteSize > (char *)pKvd + kvdLen) {
            // Not enough space for this entry
            return KTX_FILE_DATA_ERROR;
        }

        src += sizeof(keyAndValueByteSize);
        key = src;
        keyLen = 0;

        while (keyLen < keyAndValueByteSize && key[keyLen] != '\0') keyLen++;

        if (keyLen == keyAndValueByteSize || key[keyLen] != '\0') {
            // Missing NULL terminator or no value
            return KTX_FILE_DATA_ERROR;
        }

        if (keyLen >= 3 && key[0] == '\xEF' && key[1] == '\xBB' && key[2] == '\xBF') {
            // Forbidden BOM
            return KTX_FILE_DATA_ERROR;
        }

        keyLen += 1;
        value = key + keyLen;

        valueLen = keyAndValueByteSize - keyLen;
        result = ktxHashList_AddKVPair(pHead, key, valueLen,
                                       valueLen > 0 ? value : NULL);
        if (result == KTX_SUCCESS) {
            src += _KTX_PAD4(keyAndValueByteSize);
        }
    }
    return result;
}